

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psemaphore-posix.c
# Opt level: O3

pboolean p_semaphore_release(PSemaphore *sem,PError **error)

{
  int iVar1;
  
  if (sem == (PSemaphore *)0x0) {
    p_semaphore_release_cold_2();
  }
  else {
    iVar1 = sem_post((sem_t *)sem->sem_hdl);
    if (iVar1 == 0) {
      return 1;
    }
    p_semaphore_release_cold_1();
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_semaphore_release (PSemaphore	*sem,
		     PError	**error)
{
	pboolean ret;

	if (P_UNLIKELY (sem == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	ret = (sem_post (sem->sem_hdl) == 0);

	if (P_UNLIKELY (ret == FALSE))
		p_error_set_error_p (error,
				     (pint) p_error_get_last_ipc (),
				     p_error_get_last_system (),
				     "Failed to call sem_post() on semaphore");

	return ret;
}